

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ParsedParameterVector * __thiscall
pbrt::
parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
          (ParsedParameterVector *__return_storage_ptr__,pbrt *this,
          function<pstd::optional<pbrt::Token>_(int)> *nextToken,anon_class_8_1_6da50f9a ungetToken,
          Allocator alloc,bool formatting,
          function<void_(const_pbrt::Token_&,_const_char_*)> *errorCallback)

{
  ulong uVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar3;
  memory_resource *pmVar4;
  optional<pbrt::Token> *poVar5;
  Token *pTVar6;
  size_t sVar7;
  const_iterator pvVar8;
  const_iterator pvVar9;
  optional<pbrt::Token> *extraout_RAX;
  long lVar10;
  undefined7 in_register_00000089;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  ParsedParameter *param;
  ParsedParameterVector *local_120;
  uint local_118;
  undefined4 local_114;
  string_view decl;
  ValType valType;
  anon_class_8_1_898aa9a8 skipToSpace;
  anon_class_8_1_898aa9a8 skipSpace;
  aligned_storage_t<sizeof(pbrt::Token),_alignof(pbrt::Token)> local_e8;
  Token val;
  Allocator alloc_local;
  anon_class_8_1_6da50f9a ungetToken_local;
  anon_class_24_3_4da73ed2 addVal;
  optional<pbrt::Token> t;
  
  local_114 = SUB84(alloc.memoryResource,0);
  alloc_local.memoryResource = (memory_resource *)ungetToken.ungetToken;
  ungetToken_local.ungetToken = (optional<pbrt::Token> *)nextToken;
  pmVar4 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->alloc).memoryResource = pmVar4;
  __return_storage_ptr__->ptr = (ParsedParameter **)0x0;
  local_118 = 0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  local_120 = __return_storage_ptr__;
  do {
    poVar5 = std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                       (&t,(function<pstd::optional<pbrt::Token>_(int)> *)this,0);
    if (t.set == false) {
LAB_0028a4f0:
      bVar3 = false;
      local_118 = (uint)CONCAT71((int7)((ulong)poVar5 >> 8),1);
    }
    else {
      pTVar6 = pstd::optional<pbrt::Token>::value(&t);
      uVar1 = (pTVar6->token)._M_len;
      if (((uVar1 < 2) || (pcVar2 = (pTVar6->token)._M_str, *pcVar2 != '\"')) ||
         (pcVar2[uVar1 - 1] != '\"')) {
        pTVar6 = pstd::optional<pbrt::Token>::value(&t);
        parse::anon_class_8_1_6da50f9a::operator()(&ungetToken_local,*pTVar6);
        poVar5 = extraout_RAX;
        goto LAB_0028a4f0;
      }
      pTVar6 = pstd::optional<pbrt::Token>::value(&t);
      param = pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pbrt::ParsedParameter,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::FileLoc&>
                        (&alloc_local,&alloc_local,&pTVar6->loc);
      pTVar6 = pstd::optional<pbrt::Token>::value(&t);
      decl = dequoteString(pTVar6);
      pvVar9 = decl._M_str;
      sVar7 = decl._M_len;
      skipToSpace.decl = &decl;
      skipSpace.decl = skipToSpace.decl;
      pvVar8 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
               ::anon_class_8_1_898aa9a8::operator()(&skipSpace,pvVar9);
      if (pvVar8 == pvVar9 + sVar7) {
        pTVar6 = pstd::optional<pbrt::Token>::value(&t);
        local_e8.__align = (anon_struct_8_0_00000001_for___align)((long)local_e8.__data + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,decl._M_str,decl._M_str + decl._M_len);
        ErrorExit<std::__cxx11::string>
                  (&pTVar6->loc,"Parameter \"%s\" doesn\'t have a type declaration?!",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_e8.__align);
      }
      pvVar9 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
               ::anon_class_8_1_898aa9a8::operator()(&skipToSpace,pvVar8);
      std::__cxx11::string::assign<char_const*,void>((string *)param,pvVar8,pvVar9);
      if ((char)local_114 != '\0') {
        bVar3 = std::operator==(&param->type,"point");
        if (bVar3) {
          std::__cxx11::string::assign((char *)param);
        }
        bVar3 = std::operator==(&param->type,"color");
        if (bVar3) {
          std::__cxx11::string::assign((char *)param);
        }
      }
      pvVar8 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
               ::anon_class_8_1_898aa9a8::operator()(&skipSpace,pvVar9);
      __return_storage_ptr__ = local_120;
      if (pvVar8 == decl._M_str + decl._M_len) {
        pTVar6 = pstd::optional<pbrt::Token>::value(&t);
        local_e8.__align = (anon_struct_8_0_00000001_for___align)((long)local_e8.__data + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,decl._M_str,decl._M_str + decl._M_len);
        ErrorExit<std::__cxx11::string>
                  (&pTVar6->loc,"Unable to find parameter name from \"%s\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_e8.__align);
      }
      pvVar9 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
               ::anon_class_8_1_898aa9a8::operator()(&skipToSpace,pvVar8);
      std::__cxx11::string::assign<char_const*,void>((string *)&param->name,pvVar8,pvVar9);
      valType = Unknown;
      addVal.valType = &valType;
      addVal.param = &param;
      addVal.errorCallback =
           (function<void_(const_pbrt::Token_&,_const_char_*)> *)
           CONCAT71(in_register_00000089,formatting);
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&local_e8.__align,
                 (function<pstd::optional<pbrt::Token>_(int)> *)this,1);
      pTVar6 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&local_e8.__align);
      val.loc.line = (pTVar6->loc).line;
      val.loc.column = (pTVar6->loc).column;
      val.token._M_len = (pTVar6->token)._M_len;
      val.token._M_str = (pTVar6->token)._M_str;
      val.loc.filename._M_len = (pTVar6->loc).filename._M_len;
      val.loc.filename._M_str = (pTVar6->loc).filename._M_str;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&local_e8.__align);
      __x._M_str = val.token._M_str;
      __x._M_len = val.token._M_len;
      __y._M_str = "[";
      __y._M_len = 1;
      bVar3 = std::operator==(__x,__y);
      if (bVar3) {
        while( true ) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&local_e8.__align,
                     (function<pstd::optional<pbrt::Token>_(int)> *)this,1);
          pTVar6 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&local_e8.__align);
          val.loc.line = (pTVar6->loc).line;
          val.loc.column = (pTVar6->loc).column;
          val.token._M_len = (pTVar6->token)._M_len;
          val.token._M_str = (pTVar6->token)._M_str;
          val.loc.filename._M_len = (pTVar6->loc).filename._M_len;
          val.loc.filename._M_str = (pTVar6->loc).filename._M_str;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&local_e8.__align);
          __x_00._M_str = val.token._M_str;
          __x_00._M_len = val.token._M_len;
          __y_00._M_str = "]";
          __y_00._M_len = 1;
          bVar3 = std::operator==(__x_00,__y_00);
          if (bVar3) break;
          parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
          ::anon_class_24_3_4da73ed2::operator()(&addVal,&val);
        }
      }
      else {
        parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
        ::anon_class_24_3_4da73ed2::operator()(&addVal,&val);
      }
      if ((char)local_114 != '\0') {
        bVar3 = std::operator==(&param->type,"bool");
        if (bVar3) {
          __lhs = (param->strings).ptr;
          for (lVar10 = (param->strings).nStored << 5; lVar10 != 0; lVar10 = lVar10 + -0x20) {
            bVar3 = std::operator==(__lhs,"true");
            if (bVar3) {
              local_e8.__data[0] = 1;
              pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
              push_back(&param->bools,local_e8.__data);
            }
            else {
              bVar3 = std::operator==(__lhs,"false");
              if (bVar3) {
                local_e8.__align = local_e8.__align & 0xffffffffffffff00;
                pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                push_back(&param->bools,local_e8.__data);
              }
              else {
                Error<std::__cxx11::string_const&>
                          (&param->loc,"%s: neither \"true\" nor \"false\" in bool parameter list.",
                           __lhs);
              }
            }
            __lhs = __lhs + 1;
          }
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&param->strings);
        }
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::push_back(__return_storage_ptr__,&param);
      bVar3 = true;
    }
    pstd::optional<pbrt::Token>::~optional(&t);
    if (!bVar3) {
      if ((local_118 & 1) == 0) {
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::~InlinedVector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static ParsedParameterVector parseParameters(
    Next nextToken, Unget ungetToken, Allocator alloc, bool formatting,
    const std::function<void(const Token &token, const char *)> &errorCallback) {
    ParsedParameterVector parameterVector;

    while (true) {
        pstd::optional<Token> t = nextToken(TokenOptional);
        if (!t.has_value())
            return parameterVector;

        if (!isQuotedString(t->token)) {
            ungetToken(*t);
            return parameterVector;
        }

        ParsedParameter *param = alloc.new_object<ParsedParameter>(alloc, t->loc);

        std::string_view decl = dequoteString(*t);

        auto skipSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && (*iter == ' ' || *iter == '\t'))
                ++iter;
            return iter;
        };
        // Skip to the next whitespace character (or the end of the string).
        auto skipToSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && *iter != ' ' && *iter != '\t')
                ++iter;
            return iter;
        };

        auto typeBegin = skipSpace(decl.begin());
        if (typeBegin == decl.end())
            ErrorExit(&t->loc, "Parameter \"%s\" doesn't have a type declaration?!",
                      std::string(decl.begin(), decl.end()));

        // Find end of type declaration
        auto typeEnd = skipToSpace(typeBegin);
        param->type.assign(typeBegin, typeEnd);

        if (formatting) {  // close enough: upgrade...
            if (param->type == "point")
                param->type = "point3";
            if (param->type == "color")
                param->type = "rgb";
        }

        auto nameBegin = skipSpace(typeEnd);
        if (nameBegin == decl.end())
            ErrorExit(&t->loc, "Unable to find parameter name from \"%s\"",
                      std::string(decl.begin(), decl.end()));

        auto nameEnd = skipToSpace(nameBegin);
        param->name.assign(nameBegin, nameEnd);

        enum ValType { Unknown, String, Bool, Number } valType = Unknown;

        auto addVal = [&](const Token &t) {
            if (isQuotedString(t.token)) {
                switch (valType) {
                case Unknown:
                    valType = String;
                    break;
                case String:
                    break;
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddString(dequoteString(t));
            } else if (t.token[0] == 't' && t.token == "true") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(true);
            } else if (t.token[0] == 'f' && t.token == "false") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(false);
            } else {
                switch (valType) {
                case Unknown:
                    valType = Number;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    break;
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddNumber(parseNumber(t));
            }
        };

        Token val = *nextToken(TokenRequired);

        if (val.token == "[") {
            while (true) {
                val = *nextToken(TokenRequired);
                if (val.token == "]")
                    break;
                addVal(val);
            }
        } else {
            addVal(val);
        }

        if (formatting && param->type == "bool") {
            for (const auto &b : param->strings) {
                if (b == "true")
                    param->bools.push_back(true);
                else if (b == "false")
                    param->bools.push_back(false);
                else
                    Error(&param->loc,
                          "%s: neither \"true\" nor \"false\" in bool "
                          "parameter list.",
                          b);
            }
            param->strings.clear();
        }

        parameterVector.push_back(param);
    }

    return parameterVector;
}